

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

Logs * __thiscall
deqp::gles3::Performance::ShaderCompilerCase::getLogs
          (Logs *__return_storage_ptr__,ShaderCompilerCase *this,
          ShadersAndProgram *shadersAndProgram)

{
  deUint32 dVar1;
  int iVar2;
  undefined4 extraout_var;
  deUint32 in_ECX;
  int infoLogLen;
  _Vector_base<char,_std::allocator<char>_> local_68;
  string local_48;
  Performance *this_00;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  this_00 = (Performance *)CONCAT44(extraout_var,iVar2);
  Logs::Logs(__return_storage_ptr__);
  getShaderInfoLog_abi_cxx11_
            (&local_48,this_00,(Functions *)(ulong)shadersAndProgram->vertShader,in_ECX);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  getShaderInfoLog_abi_cxx11_
            (&local_48,this_00,(Functions *)(ulong)shadersAndProgram->fragShader,in_ECX);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->frag,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  dVar1 = shadersAndProgram->program;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(this_00 + 0x9d8))(dVar1,0x8b84);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&local_68,1);
  (**(code **)(this_00 + 0x988))(dVar1,1,0,local_68._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::assign((char *)&local_48);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_68);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->link,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

ShaderCompilerCase::Logs ShaderCompilerCase::getLogs (const ShadersAndProgram& shadersAndProgram) const
{
	const glw::Functions&	gl = m_context.getRenderContext().getFunctions();
	Logs					result;

	result.vert = getShaderInfoLog(gl, shadersAndProgram.vertShader);
	result.frag = getShaderInfoLog(gl, shadersAndProgram.fragShader);
	result.link = getProgramInfoLog(gl, shadersAndProgram.program);

	return result;
}